

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pUVar2;
  pointer pfVar3;
  undefined8 uVar4;
  pointer pVVar5;
  deUint64 *pdVar6;
  int *piVar7;
  pointer pUVar8;
  SampleBuilder *pSVar9;
  ulong target;
  long lVar10;
  int endNdx;
  long lVar11;
  size_type __n;
  ulong uVar12;
  pointer pfVar13;
  undefined1 auVar14 [8];
  undefined1 auVar15 [8];
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  UploadSampleAnalyzeResult UVar23;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew;
  LineParametersWithConfidence contributionFitting;
  ScopedLogSection section_1;
  size_type __dnew_1;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section;
  ScopedLogSection section_2;
  undefined1 local_a78 [12];
  float fStack_a6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a68;
  string local_a58;
  string local_a38;
  qpSampleValueTag local_a18;
  float local_a14;
  undefined1 local_a10 [8];
  undefined8 local_a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a00;
  string local_9f0;
  string local_9d0;
  qpSampleValueTag local_9b0;
  float local_9ac;
  float local_9a4;
  float local_9a0;
  float local_99c;
  LogNumber<float> local_998;
  undefined1 local_930 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  LogNumber<float> local_910;
  float local_8a8;
  float local_8a4;
  LogNumber<float> local_8a0;
  LogNumber<float> local_838;
  LogNumber<float> local_7d0;
  LogNumber<float> local_768;
  string local_700;
  LogNumber<float> local_6e0;
  LogNumber<float> local_678;
  LogNumber<float> local_610;
  LineParametersWithConfidence local_5a4;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  LogNumber<float> local_328;
  string local_2c0;
  string local_2a0;
  float local_280;
  float local_27c;
  float local_278;
  float local_274;
  float local_270;
  float local_26c;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  undefined1 local_258 [16];
  string local_240;
  ScopedLogSection local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            (&local_5a4,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a10,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_a78);
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8 >> 6;
  uVar16 = (uint)__n;
  if (0 < (int)uVar16) {
    pdVar6 = &(pUVar8->duration).fitResponseDuration;
    uVar12 = 0;
    do {
      *(deUint64 *)((long)local_a10 + uVar12 * 8) = *pdVar6;
      uVar12 = uVar12 + 1;
      pdVar6 = pdVar6 + 8;
    } while ((uVar16 & 0x7fffffff) != uVar12);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,__n,(allocator_type *)&local_998);
  uVar4 = local_a78._0_8_;
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8) >> 6);
  if (0 < (int)uVar16) {
    piVar7 = &pUVar8->writtenSize;
    uVar12 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar12 * 4) =
           (float)*piVar7 / (((float)*(ulong *)((long)local_a10 + uVar12 * 8) / 1000.0) / 1000.0);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x10;
    } while ((uVar16 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  pfVar13 = (pointer)local_a78._0_8_;
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
    pfVar13 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  }
  uVar4 = local_a78._0_8_;
  local_99c = (float)(((long)pfVar13 - local_a78._0_8_ >> 2) - 1) * 0.5;
  fVar18 = floorf(local_99c);
  fVar19 = local_99c - (float)(int)fVar18;
  local_99c = fVar19 * *(float *)(uVar4 + (long)((int)fVar18 + 1) * 4);
  local_138 = ZEXT416((uint)((1.0 - fVar19) * *(float *)(uVar4 + (long)(int)fVar18 * 4)));
  operator_delete((void *)uVar4,local_a68._M_allocated_capacity - uVar4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_998);
  uVar4 = local_a78._0_8_;
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8) >> 6);
  if (0 < (int)uVar16) {
    piVar7 = &pUVar8->writtenSize;
    uVar12 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar12 * 4) =
           (float)*(ulong *)((long)local_a10 + uVar12 * 8) -
           ((float)*piVar7 * local_5a4.coefficient + local_5a4.offset);
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x10;
    } while ((uVar16 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_998);
  uVar4 = local_a78._0_8_;
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8) >> 6);
  if (0 < (int)uVar16) {
    piVar7 = &pUVar8->writtenSize;
    uVar12 = 0;
    do {
      fVar18 = (float)*piVar7 * local_5a4.coefficient + local_5a4.offset;
      fVar19 = 0.0;
      if (1.0 <= fVar18) {
        fVar19 = ((float)*(ulong *)((long)local_a10 + uVar12 * 8) - fVar18) / fVar18;
      }
      *(float *)(local_a78._0_8_ + uVar12 * 4) = fVar19;
      uVar12 = uVar12 + 1;
      piVar7 = piVar7 + 0x10;
    } while ((uVar16 & 0x7fffffff) != uVar12);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar12 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  pVVar5 = local_a08;
  auVar14 = local_a10;
  auVar15 = local_a10;
  if (local_a10 != (undefined1  [8])local_a08) {
    uVar12 = (long)local_a08 - (long)local_a10 >> 3;
    lVar10 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a10,local_a08,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar14,pVVar5);
    auVar14 = (undefined1  [8])local_a08;
    auVar15 = local_a10;
  }
  local_25c = (float)(((long)auVar14 - (long)auVar15 >> 3) - 1) * 0.5;
  local_48 = floorf(local_25c);
  uVar12 = *(ulong *)((long)auVar15 + (long)(int)local_48 * 8);
  target = uVar12;
  if ((long)uVar12 < 0) {
    target = (ulong)((uint)uVar12 & 1) | uVar12 >> 1;
  }
  local_8a4 = (float)uVar12;
  uVar12 = *(ulong *)((long)auVar15 + (long)((int)local_48 + 1) * 8);
  if ((long)uVar12 < 0) {
    target = uVar12 >> 1;
  }
  local_8a8 = (float)uVar12;
  operator_delete((void *)auVar15,aStack_a00._M_allocated_capacity - (long)auVar15);
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x0,target);
  local_9a0 = (float)local_a08;
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x8,target);
  local_148._0_4_ = (float)local_a08;
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)&DAT_00000010,target);
  local_9a4 = (float)local_a08;
  (anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x18,target);
  local_158._0_4_ = (float)local_a08;
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Samples","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_240,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  local_8a0.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_8a0.m_name.field_2._M_local_buf[4] = 'l';
  local_8a0.m_name.field_2._M_allocated_capacity._5_2_ = 0x7365;
  local_8a0.m_name._M_string_length = 7;
  local_8a0.m_name.field_2._M_local_buf[7] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_610.m_name._M_string_length = 7;
  local_610.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_328,&local_8a0.m_name,&local_610.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_328.m_name,&local_328.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_678.m_name.field_2._M_allocated_capacity._0_2_ = 0x7257;
  local_678.m_name.field_2._M_local_buf[2] = 'i';
  local_678.m_name.field_2._M_allocated_capacity._3_4_ = 0x6e657474;
  local_678.m_name.field_2._7_4_ = 0x657a6953;
  local_678.m_name._M_string_length = 0xb;
  local_678.m_name.field_2._M_local_buf[0xb] = '\0';
  local_920._M_allocated_capacity = 0x206e657474697257;
  local_920._8_4_ = 0x657a6973;
  local_930._8_8_ = 0xc;
  local_920._M_local_buf[0xc] = '\0';
  local_700.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_700.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_700._M_string_length = 5;
  local_930._0_8_ = &local_920;
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a10,&local_678.m_name,(string *)local_930,&local_700,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a10,&local_9f0,&local_9d0,local_9b0);
  local_2a0.field_2._M_allocated_capacity = 0x6953726566667542;
  local_2a0.field_2._8_2_ = 0x657a;
  local_2a0._M_string_length = 10;
  local_2a0.field_2._M_local_buf[10] = '\0';
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_348.field_2._M_allocated_capacity._0_7_ = 0x20726566667542;
  local_348.field_2._7_4_ = 0x657a6973;
  local_348._M_string_length = 0xb;
  local_348.field_2._M_local_buf[0xb] = '\0';
  local_2c0.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_2c0.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_2c0._M_string_length = 5;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a78,&local_2a0,&local_348,&local_2c0,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a78,&local_a58,&local_a38,local_a18);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_368.field_2._8_2_ = 0x65;
  local_368._M_string_length = 9;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_388.field_2._8_2_ = 0x656d;
  local_388._M_string_length = 10;
  local_388.field_2._M_local_buf[10] = '\0';
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  local_3a8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_3a8._M_string_length = 2;
  local_3a8.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_998,&local_368,&local_388,&local_3a8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_998.m_name,&local_998.m_desc,&local_998.m_unit,local_998.m_tag);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3c8.field_2._M_allocated_capacity._0_4_ = 0x5470614d;
  local_3c8._M_string_length = 7;
  local_3c8.field_2._M_allocated_capacity._4_4_ = 0x656d69;
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  local_3e8.field_2._M_allocated_capacity = 0x656d69742070614d;
  local_3e8._M_string_length = 8;
  local_3e8.field_2._M_local_buf[8] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_408._M_string_length = 2;
  local_408.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_838,&local_3c8,&local_3e8,&local_408,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_838.m_name,&local_838.m_desc,&local_838.m_unit,local_838.m_tag);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_428.field_2._M_allocated_capacity = 0x6d695470616d6e55;
  local_428.field_2._8_2_ = 0x65;
  local_428._M_string_length = 9;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448.field_2._M_allocated_capacity = 0x69742070616d6e55;
  local_448.field_2._8_2_ = 0x656d;
  local_448._M_string_length = 10;
  local_448.field_2._M_local_buf[10] = '\0';
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  local_468.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_468._M_string_length = 2;
  local_468.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_768,&local_428,&local_448,&local_468,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_768.m_name,&local_768.m_desc,&local_768.m_unit,local_768.m_tag);
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  local_488.field_2._M_allocated_capacity = 0x6d69546574697257;
  local_488.field_2._8_2_ = 0x65;
  local_488._M_string_length = 9;
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8.field_2._M_allocated_capacity = 0x6974206574697257;
  local_4a8.field_2._8_2_ = 0x656d;
  local_4a8._M_string_length = 10;
  local_4a8.field_2._M_local_buf[10] = '\0';
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4c8._M_string_length = 2;
  local_4c8.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6e0,&local_488,&local_4a8,&local_4c8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_6e0.m_name,&local_6e0.m_desc,&local_6e0.m_unit,local_6e0.m_tag);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8.field_2._M_allocated_capacity = 0x6d69546873756c46;
  local_4e8.field_2._8_2_ = 0x65;
  local_4e8._M_string_length = 9;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_508.field_2._M_allocated_capacity = 0x6974206873756c46;
  local_508.field_2._8_2_ = 0x656d;
  local_508._M_string_length = 10;
  local_508.field_2._M_local_buf[10] = '\0';
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_528._M_string_length = 2;
  local_528.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_910,&local_4e8,&local_508,&local_528,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_910.m_name,&local_910.m_desc,&local_910.m_unit,local_910.m_tag);
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  local_548.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_548.field_2._7_4_ = 0x6c617564;
  local_548._M_string_length = 0xb;
  local_548.field_2._M_local_buf[0xb] = '\0';
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  local_568.field_2._M_allocated_capacity = 0x6973657220746946;
  local_568.field_2._8_4_ = 0x6c617564;
  local_568._M_string_length = 0xc;
  local_568.field_2._M_local_buf[0xc] = '\0';
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  local_588.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_588._M_string_length = 2;
  local_588.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7d0,&local_548,&local_568,&local_588,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_7d0.m_name,&local_7d0.m_desc,&local_7d0.m_unit,local_7d0.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_unit._M_dataplus._M_p != &local_7d0.m_unit.field_2) {
    operator_delete(local_7d0.m_unit._M_dataplus._M_p,
                    local_7d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_desc._M_dataplus._M_p != &local_7d0.m_desc.field_2) {
    operator_delete(local_7d0.m_desc._M_dataplus._M_p,
                    local_7d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    local_7d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,
                    CONCAT53(local_588.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_588.field_2._M_local_buf[2],
                                      local_588.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT17(local_548.field_2._M_local_buf[7],
                             local_548.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_unit._M_dataplus._M_p != &local_910.m_unit.field_2) {
    operator_delete(local_910.m_unit._M_dataplus._M_p,
                    local_910.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_desc._M_dataplus._M_p != &local_910.m_desc.field_2) {
    operator_delete(local_910.m_desc._M_dataplus._M_p,
                    local_910.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_910.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_910.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT53(local_528.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.field_2._M_local_buf[2],
                                      local_528.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_unit._M_dataplus._M_p != &local_6e0.m_unit.field_2) {
    operator_delete(local_6e0.m_unit._M_dataplus._M_p,
                    local_6e0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_desc._M_dataplus._M_p != &local_6e0.m_desc.field_2) {
    operator_delete(local_6e0.m_desc._M_dataplus._M_p,
                    local_6e0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_6e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                      local_6e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,
                    CONCAT53(local_4c8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4c8.field_2._M_local_buf[2],
                                      local_4c8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_unit._M_dataplus._M_p != &local_768.m_unit.field_2) {
    operator_delete(local_768.m_unit._M_dataplus._M_p,
                    local_768.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_desc._M_dataplus._M_p != &local_768.m_desc.field_2) {
    operator_delete(local_768.m_desc._M_dataplus._M_p,
                    local_768.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,
                    CONCAT53(local_468.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_468.field_2._M_local_buf[2],
                                      local_468.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_unit._M_dataplus._M_p != &local_838.m_unit.field_2) {
    operator_delete(local_838.m_unit._M_dataplus._M_p,
                    local_838.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_desc._M_dataplus._M_p != &local_838.m_desc.field_2) {
    operator_delete(local_838.m_desc._M_dataplus._M_p,
                    local_838.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    CONCAT17(local_838.m_name.field_2._M_local_buf[7],
                             local_838.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT53(local_408.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_408.field_2._M_local_buf[2],
                                      local_408.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT44(local_3c8.field_2._M_allocated_capacity._4_4_,
                             local_3c8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,
                    CONCAT53(local_3a8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3a8.field_2._M_local_buf[2],
                                      local_3a8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT26(local_2c0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                      local_2c0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT17(local_348.field_2._M_local_buf[7],
                             local_348.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,
                    CONCAT26(local_700.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_700.field_2._M_allocated_capacity._4_2_,
                                      local_700.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,local_920._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_678.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_678.m_name.field_2._M_local_buf[2],
                                               local_678.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_desc._M_dataplus._M_p != &local_328.m_desc.field_2) {
    operator_delete(local_328.m_desc._M_dataplus._M_p,
                    local_328.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    CONCAT44(local_328.m_name.field_2._M_allocated_capacity._4_4_,
                             local_328.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    local_610.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8a0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8a0.m_name.field_2._M_local_buf[4],
                                               local_8a0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8) >> 6)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      uVar12 = *(ulong *)((long)&(pUVar8->duration).fitResponseDuration + lVar11);
      local_258._0_4_ =
           (float)*(int *)((long)&pUVar8->writtenSize + lVar11) * local_5a4.coefficient +
           local_5a4.offset;
      local_a08 = (pointer)0x0;
      aStack_a00._M_allocated_capacity = 0;
      aStack_a00._8_8_ = 0;
      local_a10 = (undefined1  [8])log;
      pSVar9 = tcu::SampleBuilder::operator<<
                         ((SampleBuilder *)local_a10,*(int *)((long)&pUVar8->writtenSize + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 bufferSize + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).totalDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).mapDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).unmapDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).writeDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).flushDuration + lVar11));
      pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,(float)uVar12 - (float)local_258._0_4_);
      tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_a08 != (pointer)0x0) {
        operator_delete(local_a08,aStack_a00._8_8_ - (long)local_a08);
      }
      lVar10 = lVar10 + 1;
      pUVar8 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar11 + 0x40;
    } while (lVar10 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8
                                   ) >> 6));
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_240._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Contribution","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Contributions","");
  paVar1 = &local_8a0.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_700,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  local_838.m_name.field_2._M_allocated_capacity._0_7_ = 0x736e6f4370614d;
  local_838.m_name.field_2._M_local_buf[7] = 't';
  local_838.m_name.field_2._8_7_ = 0x74736f43746e61;
  local_838.m_name._M_string_length = 0xf;
  local_838.m_name.field_2._M_local_buf[0xf] = '\0';
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"Map: Approximated contant cost","");
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_838.m_name,&local_768.m_name,&local_6e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_910.m_name.field_2._M_allocated_capacity._0_5_ = 0x694c70614d;
  local_910.m_name.field_2._M_allocated_capacity._5_2_ = 0x656e;
  local_910.m_name.field_2._M_local_buf[7] = 'a';
  local_910.m_name.field_2._8_5_ = 0x74736f4372;
  local_910.m_name._M_string_length = 0xd;
  local_910.m_name.field_2._M_local_buf[0xd] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1d;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_998);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Map: Approximated linear cost",0x1d);
  local_7d0.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_328.m_name._M_dataplus._M_p = (pointer)&local_328.m_name.field_2;
  local_328.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_328.m_name._M_string_length = 7;
  local_328.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_7d0.m_name,&local_328.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a0.m_name.field_2._M_allocated_capacity._0_4_ = 0x4d70614d;
  local_8a0.m_name.field_2._M_local_buf[4] = 'e';
  local_8a0.m_name.field_2._M_allocated_capacity._5_2_ = 0x6964;
  local_8a0.m_name.field_2._M_local_buf[7] = 'a';
  local_8a0.m_name.field_2._8_5_ = 0x74736f436e;
  local_8a0.m_name._M_string_length = 0xd;
  local_8a0.m_name.field_2._M_local_buf[0xd] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_678.m_name._M_dataplus._M_p = &DAT_00000010;
  local_8a0.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_610.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)&local_678);
  local_610.m_name.field_2._M_allocated_capacity = (size_type)local_678.m_name._M_dataplus._M_p;
  builtin_strncpy(local_610.m_name._M_dataplus._M_p,"Map: Median cost",0x10);
  local_610.m_name._M_string_length = (size_type)local_678.m_name._M_dataplus._M_p;
  local_610.m_name._M_dataplus._M_p[(long)local_678.m_name._M_dataplus._M_p] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_678.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_678.m_name._M_string_length = 2;
  local_678.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_8a0.m_name,&local_610.m_name,&local_678.m_name,QP_KEY_TAG_TIME,
             local_9a0);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_678.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_678.m_name.field_2._M_local_buf[2],
                                               local_678.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    (ulong)(local_610.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8a0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8a0.m_name.field_2._M_local_buf[4],
                                               local_8a0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    CONCAT44(local_328.m_name.field_2._M_allocated_capacity._4_4_,
                             local_328.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_910.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_910.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_6e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                      local_6e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    CONCAT17(local_838.m_name.field_2._M_local_buf[7],
                             local_838.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,8);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"UnmapConstantCost","");
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"Unmap: Approximated contant cost","");
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_838.m_name,&local_768.m_name,&local_6e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_910.m_name.field_2._M_allocated_capacity._0_5_ = 0x70616d6e55;
  local_910.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_910.m_name.field_2._M_local_buf[7] = 'n';
  local_910.m_name.field_2._8_5_ = 0x6f43726165;
  local_910.m_name.field_2._M_local_buf[0xd] = 's';
  local_910.m_name.field_2._M_local_buf[0xe] = 't';
  local_910.m_name._M_string_length = 0xf;
  local_910.m_name.field_2._M_local_buf[0xf] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1f;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_998);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Unmap: Approximated linear cost",0x1f);
  local_7d0.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_328.m_name._M_dataplus._M_p = (pointer)&local_328.m_name.field_2;
  local_328.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_328.m_name._M_string_length = 7;
  local_328.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_7d0.m_name,&local_328.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a0.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
  local_8a0.m_name.field_2._M_local_buf[4] = 'p';
  local_8a0.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_8a0.m_name.field_2._M_local_buf[7] = 'd';
  local_8a0.m_name.field_2._8_5_ = 0x6f436e6169;
  local_8a0.m_name.field_2._M_local_buf[0xd] = 's';
  local_8a0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8a0.m_name._M_string_length = 0xf;
  local_8a0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_678.m_name._M_dataplus._M_p = (pointer)0x12;
  local_8a0.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_610.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)&local_678);
  local_610.m_name.field_2._M_allocated_capacity = (size_type)local_678.m_name._M_dataplus._M_p;
  builtin_strncpy(local_610.m_name._M_dataplus._M_p,"Unmap: Median cost",0x12);
  local_610.m_name._M_string_length = (size_type)local_678.m_name._M_dataplus._M_p;
  local_610.m_name._M_dataplus._M_p[(long)local_678.m_name._M_dataplus._M_p] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_678.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_678.m_name._M_string_length = 2;
  local_678.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_8a0.m_name,&local_610.m_name,&local_678.m_name,QP_KEY_TAG_TIME,
             (float)local_148._0_4_);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_678.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_678.m_name.field_2._M_local_buf[2],
                                               local_678.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    local_610.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8a0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8a0.m_name.field_2._M_local_buf[4],
                                               local_8a0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    CONCAT44(local_328.m_name.field_2._M_allocated_capacity._4_4_,
                             local_328.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_910.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_910.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_6e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                      local_6e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    CONCAT17(local_838.m_name.field_2._M_local_buf[7],
                             local_838.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x10);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"WriteConstantCost","");
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"Write: Approximated contant cost","");
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_838.m_name,&local_768.m_name,&local_6e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_910.m_name.field_2._M_allocated_capacity._0_5_ = 0x6574697257;
  local_910.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_910.m_name.field_2._M_local_buf[7] = 'n';
  local_910.m_name.field_2._8_5_ = 0x6f43726165;
  local_910.m_name.field_2._M_local_buf[0xd] = 's';
  local_910.m_name.field_2._M_local_buf[0xe] = 't';
  local_910.m_name._M_string_length = 0xf;
  local_910.m_name.field_2._M_local_buf[0xf] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1f;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_998);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Write: Approximated linear cost",0x1f);
  local_7d0.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_328.m_name._M_dataplus._M_p = (pointer)&local_328.m_name.field_2;
  local_328.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_328.m_name._M_string_length = 7;
  local_328.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_7d0.m_name,&local_328.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a0.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
  local_8a0.m_name.field_2._M_local_buf[4] = 'e';
  local_8a0.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_8a0.m_name.field_2._M_local_buf[7] = 'd';
  local_8a0.m_name.field_2._8_5_ = 0x6f436e6169;
  local_8a0.m_name.field_2._M_local_buf[0xd] = 's';
  local_8a0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8a0.m_name._M_string_length = 0xf;
  local_8a0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_678.m_name._M_dataplus._M_p = (pointer)0x12;
  local_8a0.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_610.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)&local_678);
  local_610.m_name.field_2._M_allocated_capacity = (size_type)local_678.m_name._M_dataplus._M_p;
  builtin_strncpy(local_610.m_name._M_dataplus._M_p,"Write: Median cost",0x12);
  local_610.m_name._M_string_length = (size_type)local_678.m_name._M_dataplus._M_p;
  local_610.m_name._M_dataplus._M_p[(long)local_678.m_name._M_dataplus._M_p] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_678.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_678.m_name._M_string_length = 2;
  local_678.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_8a0.m_name,&local_610.m_name,&local_678.m_name,QP_KEY_TAG_TIME,
             local_9a4);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_678.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_678.m_name.field_2._M_local_buf[2],
                                               local_678.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    local_610.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8a0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8a0.m_name.field_2._M_local_buf[4],
                                               local_8a0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    CONCAT44(local_328.m_name.field_2._M_allocated_capacity._4_4_,
                             local_328.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_910.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_910.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_6e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                      local_6e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    CONCAT17(local_838.m_name.field_2._M_local_buf[7],
                             local_838.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x18);
  local_838.m_name._M_dataplus._M_p = (pointer)&local_838.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"FlushConstantCost","");
  local_768.m_name._M_dataplus._M_p = (pointer)&local_768.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_768,"Flush: Approximated contant cost","");
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_838.m_name,&local_768.m_name,&local_6e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_910.m_name._M_dataplus._M_p = (pointer)&local_910.m_name.field_2;
  local_910.m_name.field_2._M_allocated_capacity._0_5_ = 0x6873756c46;
  local_910.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_910.m_name.field_2._M_local_buf[7] = 'n';
  local_910.m_name.field_2._8_5_ = 0x6f43726165;
  local_910.m_name.field_2._M_local_buf[0xd] = 's';
  local_910.m_name.field_2._M_local_buf[0xe] = 't';
  local_910.m_name._M_string_length = 0xf;
  local_910.m_name.field_2._M_local_buf[0xf] = '\0';
  local_7d0.m_name._M_dataplus._M_p = (pointer)&local_7d0.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1f;
  local_7d0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_7d0,(ulong)&local_998);
  local_7d0.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_7d0.m_name._M_dataplus._M_p,"Flush: Approximated linear cost",0x1f);
  local_7d0.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_7d0.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_328.m_name._M_dataplus._M_p = (pointer)&local_328.m_name.field_2;
  local_328.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_328.m_name._M_string_length = 7;
  local_328.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_910.m_name,&local_7d0.m_name,&local_328.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_8a0.m_name.field_2._M_allocated_capacity._0_4_ = 0x73756c46;
  local_8a0.m_name.field_2._M_local_buf[4] = 'h';
  local_8a0.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_8a0.m_name.field_2._M_local_buf[7] = 'd';
  local_8a0.m_name.field_2._8_5_ = 0x6f436e6169;
  local_8a0.m_name.field_2._M_local_buf[0xd] = 's';
  local_8a0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8a0.m_name._M_string_length = 0xf;
  local_8a0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_610.m_name._M_dataplus._M_p = (pointer)&local_610.m_name.field_2;
  local_678.m_name._M_dataplus._M_p = (pointer)0x12;
  local_8a0.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_610.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)&local_678);
  local_610.m_name.field_2._M_allocated_capacity = (size_type)local_678.m_name._M_dataplus._M_p;
  builtin_strncpy(local_610.m_name._M_dataplus._M_p,"Flush: Median cost",0x12);
  local_610.m_name._M_string_length = (size_type)local_678.m_name._M_dataplus._M_p;
  local_610.m_name._M_dataplus._M_p[(long)local_678.m_name._M_dataplus._M_p] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_678.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_678.m_name._M_string_length = 2;
  local_678.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_8a0.m_name,&local_610.m_name,&local_678.m_name,QP_KEY_TAG_TIME,
             (float)local_158._0_4_);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_678.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_678.m_name.field_2._M_local_buf[2],
                                               local_678.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    local_610.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8a0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8a0.m_name.field_2._M_local_buf[4],
                                               local_8a0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    CONCAT44(local_328.m_name.field_2._M_allocated_capacity._4_4_,
                             local_328.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_910.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_910.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_6e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                      local_6e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    CONCAT17(local_838.m_name.field_2._M_local_buf[7],
                             local_838.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_700._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Results","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_220,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar19 = (float)((pUVar2[-1].bufferSize + pUVar8->bufferSize) / 2);
  local_280 = local_5a4.coefficient * fVar19;
  local_27c = local_5a4.offset + local_280;
  uVar12 = (long)pUVar2 - (long)pUVar8;
  endNdx = (int)(((uint)(uVar12 >> 0x25) & 1) + (int)(uVar12 >> 6)) >> 1;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a10,samples,0,endNdx,1,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a78,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar18 = (float)pUVar8->writtenSize;
  local_9a0 = (float)pUVar2[-1].writtenSize;
  local_258._0_4_ = fVar18;
  local_264 = (float)local_a10._0_4_;
  local_148 = ZEXT416((uint)local_a08._4_4_);
  local_260 = (float)local_a78._0_4_;
  local_158 = ZEXT416((uint)fStack_a6c);
  local_9a4 = getAreaBetweenLines(fVar18,local_9a0,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a10,samples,0,
             (int)((ulong)((long)pUVar2 - (long)pUVar8) >> 6),2,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a78,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),2,0x28);
  local_268 = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  local_26c = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  local_278 = (float)local_a10._0_4_;
  local_58 = ZEXT416((uint)local_a08._4_4_);
  local_274 = (float)local_a78._0_4_;
  local_68 = ZEXT416((uint)fStack_a6c);
  local_270 = getAreaBetweenLines(local_268,local_26c,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  local_930._0_8_ = &local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"ResultLinearity","");
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"Sample linearity","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"%","");
  fVar18 = (float)local_148._0_4_ * (float)local_258._0_4_ + local_264;
  fVar20 = (float)local_158._0_4_ * (float)local_258._0_4_ + local_260;
  uVar16 = -(uint)(fVar18 <= fVar20);
  fVar21 = (float)local_148._0_4_ * local_9a0 + local_264;
  fVar22 = (float)local_158._0_4_ * local_9a0 + local_260;
  uVar17 = -(uint)(fVar22 <= fVar21);
  fVar18 = ((float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17) -
           (float)(~uVar16 & (uint)fVar20 | (uint)fVar18 & uVar16)) *
           (local_9a0 - (float)local_258._0_4_);
  fVar20 = (float)(~-(uint)(fVar18 < 1e-06) & (uint)(1.0 - local_9a4 / fVar18));
  fVar18 = 1.0;
  if (fVar20 <= 1.0) {
    fVar18 = fVar20;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,(string *)local_930,&local_700,&local_2a0,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar20 < 0.0) & (uint)(fVar18 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"SampleTemporalStability","")
  ;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Sample temporal stability","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"%","");
  fVar18 = (float)local_58._0_4_ * local_268 + local_278;
  fVar20 = (float)local_68._0_4_ * local_268 + local_274;
  uVar16 = -(uint)(fVar18 <= fVar20);
  fVar21 = (float)local_58._0_4_ * local_26c + local_278;
  fVar22 = (float)local_68._0_4_ * local_26c + local_274;
  uVar17 = -(uint)(fVar22 <= fVar21);
  fVar18 = ((float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17) -
           (float)(~uVar16 & (uint)fVar20 | (uint)fVar18 & uVar16)) * (local_26c - local_268);
  fVar20 = (float)(~-(uint)(fVar18 < 1e-06) & (uint)(1.0 - local_270 / fVar18));
  fVar18 = 1.0;
  if (fVar20 <= 1.0) {
    fVar18 = fVar20;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_348,&local_2c0,&local_368,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar20 < 0.0) & (uint)(fVar18 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,"ApproximatedConstantCost","");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"Approximated contant cost","");
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_388,&local_3a8,&local_3c8,QP_KEY_TAG_TIME,local_5a4.offset);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,"ApproximatedConstantCostConfidence60Lower","");
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_408,"Approximated contant cost 60% confidence lower limit","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_838,&local_3e8,&local_408,&local_428,QP_KEY_TAG_TIME,
             local_5a4.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_838.m_name._M_dataplus._M_p,local_838.m_desc._M_dataplus._M_p,
             local_838.m_unit._M_dataplus._M_p,local_838.m_tag,local_838.m_value);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,"ApproximatedConstantCostConfidence60Upper","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_468,"Approximated contant cost 60% confidence upper limit","");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_768,&local_448,&local_468,&local_488,QP_KEY_TAG_TIME,
             local_5a4.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_768.m_name._M_dataplus._M_p,local_768.m_desc._M_dataplus._M_p,
             local_768.m_unit._M_dataplus._M_p,local_768.m_tag,local_768.m_value);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"ApproximatedLinearCost","");
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4c8,"Approximated linear cost","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_6e0,&local_4a8,&local_4c8,&local_4e8,QP_KEY_TAG_TIME,
             local_5a4.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_6e0.m_name._M_dataplus._M_p,local_6e0.m_desc._M_dataplus._M_p,
             local_6e0.m_unit._M_dataplus._M_p,local_6e0.m_tag,local_6e0.m_value);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_508,"ApproximatedLinearCostConfidence60Lower","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_528,"Approximated linear cost 60% confidence lower limit","");
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_910,&local_508,&local_528,&local_548,QP_KEY_TAG_TIME,
             local_5a4.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_910.m_name._M_dataplus._M_p,local_910.m_desc._M_dataplus._M_p,
             local_910.m_unit._M_dataplus._M_p,local_910.m_tag,local_910.m_value);
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_568,"ApproximatedLinearCostConfidence60Upper","");
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_588,"Approximated linear cost 60% confidence upper limit","");
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_7d0,&local_568,&local_588,&local_240,QP_KEY_TAG_TIME,
             local_5a4.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_7d0.m_name._M_dataplus._M_p,local_7d0.m_desc._M_dataplus._M_p,
             local_7d0.m_unit._M_dataplus._M_p,local_7d0.m_tag,local_7d0.m_value);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"ApproximatedTransferRate","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,"Approximated transfer rate","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"MB / s","");
  fVar18 = fVar19 / ((local_27c / 1000.0) / 1000.0);
  local_258 = ZEXT416((uint)fVar18);
  tcu::LogNumber<float>::LogNumber
            (&local_328,&local_178,&local_198,&local_1b8,QP_KEY_TAG_PERFORMANCE,
             fVar18 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_328.m_name._M_dataplus._M_p,local_328.m_desc._M_dataplus._M_p,
             local_328.m_unit._M_dataplus._M_p,local_328.m_tag,local_328.m_value);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"ApproximatedTransferRateNoConstant","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"Approximated transfer rate without constant cost","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_8a0,&local_1d8,&local_1f8,&local_218,QP_KEY_TAG_PERFORMANCE,
             (fVar19 / ((local_280 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_8a0.m_name._M_dataplus._M_p,local_8a0.m_desc._M_dataplus._M_p,
             local_8a0.m_unit._M_dataplus._M_p,local_8a0.m_tag,local_8a0.m_value);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"SampleMedianTime","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Median sample time","");
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_610,&local_88,&local_a8,&local_c8,QP_KEY_TAG_TIME,
             (local_25c - (float)(int)local_48) * local_8a8 +
             local_8a4 * (1.0 - (local_25c - (float)(int)local_48)));
  tcu::TestLog::writeFloat
            (log,local_610.m_name._M_dataplus._M_p,local_610.m_desc._M_dataplus._M_p,
             local_610.m_unit._M_dataplus._M_p,local_610.m_tag,local_610.m_value);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SampleMedianTransfer","");
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Median transfer rate","");
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"MB / s","");
  local_138._0_4_ = (float)local_138._0_4_ + local_99c;
  fVar18 = 0.0009765625;
  tcu::LogNumber<float>::LogNumber
            (&local_678,&local_e8,&local_108,&local_128,QP_KEY_TAG_PERFORMANCE,
             (float)local_138._0_4_ * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_678.m_name._M_dataplus._M_p,local_678.m_desc._M_dataplus._M_p,
             local_678.m_unit._M_dataplus._M_p,local_678.m_tag,local_678.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_unit._M_dataplus._M_p != &local_678.m_unit.field_2) {
    operator_delete(local_678.m_unit._M_dataplus._M_p,
                    local_678.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_desc._M_dataplus._M_p != &local_678.m_desc.field_2) {
    operator_delete(local_678.m_desc._M_dataplus._M_p,
                    local_678.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    CONCAT17(local_678.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_678.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_678.m_name.field_2._M_local_buf[2],
                                               local_678.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_unit._M_dataplus._M_p != &local_610.m_unit.field_2) {
    operator_delete(local_610.m_unit._M_dataplus._M_p,
                    local_610.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_desc._M_dataplus._M_p != &local_610.m_desc.field_2) {
    operator_delete(local_610.m_desc._M_dataplus._M_p,
                    local_610.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610.m_name._M_dataplus._M_p != &local_610.m_name.field_2) {
    operator_delete(local_610.m_name._M_dataplus._M_p,
                    local_610.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_unit._M_dataplus._M_p != &local_8a0.m_unit.field_2) {
    operator_delete(local_8a0.m_unit._M_dataplus._M_p,
                    local_8a0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_desc._M_dataplus._M_p != &local_8a0.m_desc.field_2) {
    operator_delete(local_8a0.m_desc._M_dataplus._M_p,
                    local_8a0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_8a0.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_8a0.m_name.field_2._M_local_buf[4],
                                               local_8a0.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_unit._M_dataplus._M_p != &local_328.m_unit.field_2) {
    operator_delete(local_328.m_unit._M_dataplus._M_p,
                    local_328.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_desc._M_dataplus._M_p != &local_328.m_desc.field_2) {
    operator_delete(local_328.m_desc._M_dataplus._M_p,
                    local_328.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
    operator_delete(local_328.m_name._M_dataplus._M_p,
                    CONCAT44(local_328.m_name.field_2._M_allocated_capacity._4_4_,
                             local_328.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_unit._M_dataplus._M_p != &local_7d0.m_unit.field_2) {
    operator_delete(local_7d0.m_unit._M_dataplus._M_p,
                    local_7d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_desc._M_dataplus._M_p != &local_7d0.m_desc.field_2) {
    operator_delete(local_7d0.m_desc._M_dataplus._M_p,
                    local_7d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0.m_name._M_dataplus._M_p != &local_7d0.m_name.field_2) {
    operator_delete(local_7d0.m_name._M_dataplus._M_p,
                    (ulong)(local_7d0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,
                    CONCAT53(local_588.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_588.field_2._M_local_buf[2],
                                      local_588.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_unit._M_dataplus._M_p != &local_910.m_unit.field_2) {
    operator_delete(local_910.m_unit._M_dataplus._M_p,
                    local_910.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_desc._M_dataplus._M_p != &local_910.m_desc.field_2) {
    operator_delete(local_910.m_desc._M_dataplus._M_p,
                    local_910.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910.m_name._M_dataplus._M_p != &local_910.m_name.field_2) {
    operator_delete(local_910.m_name._M_dataplus._M_p,
                    CONCAT17(local_910.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_910.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_910.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT17(local_548.field_2._M_local_buf[7],
                             local_548.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT53(local_528.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_528.field_2._M_local_buf[2],
                                      local_528.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_unit._M_dataplus._M_p != &local_6e0.m_unit.field_2) {
    operator_delete(local_6e0.m_unit._M_dataplus._M_p,
                    local_6e0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_desc._M_dataplus._M_p != &local_6e0.m_desc.field_2) {
    operator_delete(local_6e0.m_desc._M_dataplus._M_p,
                    local_6e0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_6e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                      local_6e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,
                    CONCAT53(local_4c8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4c8.field_2._M_local_buf[2],
                                      local_4c8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_unit._M_dataplus._M_p != &local_768.m_unit.field_2) {
    operator_delete(local_768.m_unit._M_dataplus._M_p,
                    local_768.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_desc._M_dataplus._M_p != &local_768.m_desc.field_2) {
    operator_delete(local_768.m_desc._M_dataplus._M_p,
                    local_768.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768.m_name._M_dataplus._M_p != &local_768.m_name.field_2) {
    operator_delete(local_768.m_name._M_dataplus._M_p,
                    local_768.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,
                    CONCAT53(local_468.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_468.field_2._M_local_buf[2],
                                      local_468.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_unit._M_dataplus._M_p != &local_838.m_unit.field_2) {
    operator_delete(local_838.m_unit._M_dataplus._M_p,
                    local_838.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_desc._M_dataplus._M_p != &local_838.m_desc.field_2) {
    operator_delete(local_838.m_desc._M_dataplus._M_p,
                    local_838.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838.m_name._M_dataplus._M_p != &local_838.m_name.field_2) {
    operator_delete(local_838.m_name._M_dataplus._M_p,
                    CONCAT17(local_838.m_name.field_2._M_local_buf[7],
                             local_838.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT53(local_408.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_408.field_2._M_local_buf[2],
                                      local_408.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,
                    CONCAT44(local_3c8.field_2._M_allocated_capacity._4_4_,
                             local_3c8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,
                    CONCAT53(local_3a8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_3a8.field_2._M_local_buf[2],
                                      local_3a8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT26(local_2c0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_2c0.field_2._M_allocated_capacity._4_2_,
                                      local_2c0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT17(local_348.field_2._M_local_buf[7],
                             local_348.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,
                    CONCAT26(local_700.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_700.field_2._M_allocated_capacity._4_2_,
                                      local_700.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,local_920._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(local_220.m_log);
  UVar23.transferRateAtRange = (float)local_258._0_4_;
  UVar23.transferRateMedian = (float)local_138._0_4_;
  UVar23.transferRateAtInfinity = fVar18;
  return UVar23;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}